

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O1

size_t nghttp2_frame_trail_padlen(nghttp2_frame *frame,size_t padlen)

{
  if (padlen != 0) {
    return padlen - (((frame->hd).flags >> 3 & 1) != 0);
  }
  return 0;
}

Assistant:

size_t nghttp2_frame_trail_padlen(nghttp2_frame *frame, size_t padlen) {
  /* We have iframe->padlen == 0, but iframe->frame.hd.flags may have
     NGHTTP2_FLAG_PADDED set.  This happens when receiving
     CONTINUATION frame, since we don't reset flags after HEADERS was
     received. */
  if (padlen == 0) {
    return 0;
  }
  return padlen - ((frame->hd.flags & NGHTTP2_FLAG_PADDED) > 0);
}